

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_functions.cpp
# Opt level: O2

LogicalType *
duckdb::LambdaFunctions::BindBinaryLambda
          (LogicalType *__return_storage_ptr__,idx_t parameter_idx,LogicalType *list_child_type)

{
  BinderException *this;
  allocator local_39;
  string local_38;
  
  if (parameter_idx == 1) {
    LogicalType::LogicalType(__return_storage_ptr__,BIGINT);
  }
  else {
    if (parameter_idx != 0) {
      this = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_38,
                 "This lambda function only supports up to two lambda parameters!",&local_39);
      BinderException::BinderException(this,&local_38);
      __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType(__return_storage_ptr__,list_child_type);
  }
  return __return_storage_ptr__;
}

Assistant:

LogicalType LambdaFunctions::BindBinaryLambda(const idx_t parameter_idx, const LogicalType &list_child_type) {
	switch (parameter_idx) {
	case 0:
		return list_child_type;
	case 1:
		return LogicalType::BIGINT;
	default:
		throw BinderException("This lambda function only supports up to two lambda parameters!");
	}
}